

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_text_v
          (Image *this,ssize_t x,ssize_t y,ssize_t *width,ssize_t *height,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a,uint64_t br,uint64_t bg,uint64_t bb,uint64_t ba,char *fmt,
          __va_list_tag *va)

{
  size_type sVar1;
  byte *pbVar2;
  long local_c8;
  out_of_range *e;
  ssize_t xx;
  ssize_t yy;
  byte local_79;
  ulong uStack_78;
  uint8_t ch;
  size_t z;
  ssize_t y_pos;
  ssize_t x_pos;
  ssize_t max_x_pos;
  string buffer;
  uint64_t r_local;
  ssize_t *height_local;
  ssize_t *width_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *this_local;
  
  buffer.field_2._8_8_ = r;
  string_vprintf_abi_cxx11_((string *)&max_x_pos,(phosg *)fmt,(char *)va,(__va_list_tag *)width);
  x_pos = 0;
  z = y;
  y_pos = x;
  for (uStack_78 = 0;
      sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&max_x_pos),
      uStack_78 < sVar1; uStack_78 = uStack_78 + 1) {
    pbVar2 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&max_x_pos,uStack_78);
    local_79 = *pbVar2;
    if (local_79 != 0xd) {
      if (local_79 == 10) {
        if (ba != 0) {
          fill_rect(this,y_pos + -1,z - 1,1,9,br,bg,bb,ba);
        }
        z = z + 8;
        y_pos = x;
        if (x_pos < x) {
          x_pos = x;
        }
      }
      else {
        if ((local_79 < 0x20) || (0x7f < local_79)) {
          local_79 = 0x7f;
        }
        if (ba != 0) {
          fill_rect(this,y_pos + -1,z - 1,6,9,br,bg,bb,ba);
        }
        for (xx = 0; xx < 7; xx = xx + 1) {
          for (e = (out_of_range *)0x0; (long)e < 5; e = e + 1) {
            if (e[(long)(font + xx * 5 + (ulong)(byte)(local_79 - 0x20) * 0x23)] !=
                (out_of_range)0x0) {
              write_pixel(this,(ssize_t)(e + y_pos),z + xx,buffer.field_2._8_8_,g,b,a);
            }
          }
        }
        y_pos = y_pos + 6;
      }
    }
  }
  fill_rect(this,y_pos + -1,z - 1,1,9,br,bg,bb,ba);
  if (width != (ssize_t *)0x0) {
    if (x_pos < y_pos) {
      local_c8 = y_pos;
    }
    else {
      local_c8 = x_pos;
    }
    *width = local_c8 - x;
  }
  if (height != (ssize_t *)0x0) {
    *height = (z + 7) - y;
  }
  ::std::__cxx11::string::~string((string *)&max_x_pos);
  return;
}

Assistant:

void Image::draw_text_v(ssize_t x, ssize_t y, ssize_t* width, ssize_t* height,
    uint64_t r, uint64_t g, uint64_t b, uint64_t a, uint64_t br, uint64_t bg,
    uint64_t bb, uint64_t ba, const char* fmt, va_list va) {

  string buffer = string_vprintf(fmt, va);

  ssize_t max_x_pos = 0;
  ssize_t x_pos = x, y_pos = y;
  for (size_t z = 0; z < buffer.size(); z++) {
    uint8_t ch = buffer[z];
    if (ch == '\r') {
      continue;
    }
    if (ch == '\n') {
      if (ba) {
        this->fill_rect(x_pos - 1, y_pos - 1, 1, 9, br, bg, bb, ba);
      }
      y_pos += 8;
      x_pos = x;
      if (x_pos > max_x_pos) {
        max_x_pos = x_pos;
      }
      continue;
    }

    if (ch < 0x20 || ch > 0x7F) {
      ch = 0x7F;
    }
    ch -= 0x20;

    if (ba) {
      this->fill_rect(x_pos - 1, y_pos - 1, 6, 9, br, bg, bb, ba);
    }
    for (ssize_t yy = 0; yy < 7; yy++) {
      for (ssize_t xx = 0; xx < 5; xx++) {
        if (!font[ch][yy * 5 + xx]) {
          continue;
        }
        try {
          this->write_pixel(x_pos + xx, y_pos + yy, r, g, b, a);
        } catch (const out_of_range& e) {
        }
      }
    }

    x_pos += 6;
  }

  this->fill_rect(x_pos - 1, y_pos - 1, 1, 9, br, bg, bb, ba);

  if (width) {
    *width = (x_pos > max_x_pos ? x_pos : max_x_pos) - x;
  }
  if (height) {
    *height = y_pos + 7 - y;
  }
}